

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

void __thiscall
llvm::Expected<llvm::DWARFDebugNames::Entry>::moveConstruct<llvm::DWARFDebugNames::Entry>
          (Expected<llvm::DWARFDebugNames::Entry> *this,
          Expected<llvm::DWARFDebugNames::Entry> *Other)

{
  undefined8 uVar1;
  byte bVar2;
  
  bVar2 = Other->field_0xb8 & 1;
  this->field_0xb8 = this->field_0xb8 & 0xfe | bVar2;
  if (bVar2 == 0) {
    if ((Other->field_0xb8 & 1) != 0) {
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                    ,0x272,
                    "storage_type *llvm::Expected<llvm::DWARFDebugNames::Entry>::getStorage() [T = llvm::DWARFDebugNames::Entry]"
                   );
    }
    *(undefined ***)(this->field_0).ErrorStorage.buffer = &PTR___cxa_pure_virtual_01077f88;
    SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
              ((SmallVector<llvm::DWARFFormValue,_3U> *)((long)&this->field_0 + 8),
               (SmallVector<llvm::DWARFFormValue,_3U> *)((long)&Other->field_0 + 8));
    *(undefined ***)(this->field_0).ErrorStorage.buffer = &PTR_getCUOffset_01077e88;
    uVar1 = *(undefined8 *)((long)&Other->field_0 + 0xb0);
    *(undefined8 *)((long)&this->field_0 + 0xa8) = *(undefined8 *)((long)&Other->field_0 + 0xa8);
    *(undefined8 *)((long)&this->field_0 + 0xb0) = uVar1;
  }
  else {
    if ((Other->field_0xb8 & 1) == 0) {
      __assert_fail("HasError && \"Cannot get error when a value exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                    ,0x27c,
                    "error_type *llvm::Expected<llvm::DWARFDebugNames::Entry>::getErrorStorage() [T = llvm::DWARFDebugNames::Entry]"
                   );
    }
    *(undefined8 *)(this->field_0).ErrorStorage.buffer =
         *(undefined8 *)(Other->field_0).ErrorStorage.buffer;
    *(undefined8 *)(Other->field_0).ErrorStorage.buffer = 0;
  }
  return;
}

Assistant:

void moveConstruct(Expected<OtherT> &&Other) {
    HasError = Other.HasError;
#if LLVM_ENABLE_ABI_BREAKING_CHECKS
    Unchecked = true;
    Other.Unchecked = false;
#endif

    if (!HasError)
      new (getStorage()) storage_type(std::move(*Other.getStorage()));
    else
      new (getErrorStorage()) error_type(std::move(*Other.getErrorStorage()));
  }